

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lyd_node * lyd_attr_parent(lyd_node *root,lyd_attr *attr)

{
  lyd_attr *plVar1;
  lyd_node *plVar2;
  lyd_node *plVar3;
  lyd_attr **pplVar4;
  lyd_node *plVar5;
  
  plVar3 = root;
  while( true ) {
    if (plVar3 == (lyd_node *)0x0) {
      return (lyd_node *)0x0;
    }
    pplVar4 = &plVar3->attr;
    while (plVar1 = *pplVar4, plVar1 != (lyd_attr *)0x0) {
      pplVar4 = &plVar1->next;
      if (plVar1 == attr) {
        return plVar3;
      }
    }
    plVar5 = plVar3;
    if (((plVar3->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) &&
       (plVar2 = plVar3->child, plVar3->child != (lyd_node *)0x0)) goto LAB_001669ea;
    if (plVar3 == root) break;
    do {
      plVar2 = plVar5->next;
LAB_001669ea:
      plVar3 = plVar2;
    } while ((plVar3 == (lyd_node *)0x0) &&
            (plVar5 = plVar5->parent, plVar5->parent != root->parent));
  }
  return (lyd_node *)0x0;
}

Assistant:

const struct lyd_node *
lyd_attr_parent(const struct lyd_node *root, struct lyd_attr *attr)
{
    const struct lyd_node *next, *elem;
    struct lyd_attr *node_attr;

    LY_TREE_DFS_BEGIN(root, next, elem) {
        for (node_attr = elem->attr; node_attr; node_attr = node_attr->next) {
            if (node_attr == attr) {
                return elem;
            }
        }
        LY_TREE_DFS_END(root, next, elem)
    }

    return NULL;
}